

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_npn_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *ssl;
  int iVar1;
  bool bVar2;
  
  ssl = hs->ssl;
  bVar2 = true;
  if ((((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->next_proto_select_cb !=
       (_func_int_SSL_ptr_uint8_t_ptr_ptr_uint8_t_ptr_uint8_t_ptr_uint_void_ptr *)0x0) &&
     ((ssl->s3->field_0xdc & 0x10) == 0)) {
    iVar1 = SSL_is_dtls(ssl);
    if ((iVar1 == 0) && ((type != ssl_client_hello_inner && (hs->min_version < 0x304)))) {
      iVar1 = CBB_add_u16(out,0x3374);
      if (iVar1 == 0) {
        bVar2 = false;
      }
      else {
        iVar1 = CBB_add_u16(out,0);
        bVar2 = iVar1 != 0;
      }
    }
  }
  return bVar2;
}

Assistant:

static bool ext_npn_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                    CBB *out_compressible,
                                    ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  if (ssl->ctx->next_proto_select_cb == NULL ||
      // Do not allow NPN to change on renegotiation.
      ssl->s3->initial_handshake_complete ||
      // NPN is not defined in DTLS or TLS 1.3.
      SSL_is_dtls(ssl) || hs->min_version >= TLS1_3_VERSION ||
      type == ssl_client_hello_inner) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_next_proto_neg) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}